

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O3

int mraa_get_default_i2c_bus(uint8_t platform_offset)

{
  uint uVar1;
  mraa_board_t *pmVar2;
  
  uVar1 = 0xffffffff;
  if ((plat != (mraa_board_t *)0x0) &&
     ((pmVar2 = plat, platform_offset == '\0' ||
      (pmVar2 = plat->sub_platform, pmVar2 != (mraa_board_t *)0x0)))) {
    uVar1 = pmVar2->def_i2c_bus;
  }
  return uVar1;
}

Assistant:

int
mraa_get_default_i2c_bus(uint8_t platform_offset)
{
    if (plat == NULL)
        return -1;
    if (platform_offset == MRAA_MAIN_PLATFORM_OFFSET) {
        return plat->def_i2c_bus;
    } else {
        if (mraa_has_sub_platform())
            return plat->sub_platform->def_i2c_bus;
        else
            return -1;
    }
}